

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenVerifyCall(CppGenerator *this,FieldDef *field,char *prefix)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  size_t t;
  ulong uVar4;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  undefined1 local_468 [8];
  string nfn;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *prefix_local;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  local_20 = prefix;
  prefix_local = (char *)field;
  field_local = (FieldDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"PRE",&local_41);
  pcVar3 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar3,&local_79);
  CodeWriter::SetValue(&this->code_,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"NAME",&local_a1);
  Name_abi_cxx11_(&local_c8,this,(FieldDef *)prefix_local);
  CodeWriter::SetValue(&this->code_,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"REQUIRED",&local_e9);
  bVar2 = FieldDef::IsRequired((FieldDef *)prefix_local);
  pcVar3 = "";
  if (bVar2) {
    pcVar3 = "Required";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar3,&local_111);
  CodeWriter::SetValue(&this->code_,&local_e8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"SIZE",&local_139);
  GenTypeSize_abi_cxx11_(&local_160,this,(Type *)(prefix_local + 200));
  CodeWriter::SetValue(&this->code_,&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"OFFSET",&local_181);
  GenFieldOffsetName_abi_cxx11_(&local_1a8,this,(FieldDef *)prefix_local);
  CodeWriter::SetValue(&this->code_,&local_180,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  bVar2 = IsScalar(*(BaseType *)(prefix_local + 200));
  if ((bVar2) || (bVar2 = IsStruct((Type *)(prefix_local + 200)), bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"ALIGN",&local_1c9);
    t = InlineAlignment((Type *)(prefix_local + 200));
    NumToString<unsigned_long>(&local_1f0,t);
    CodeWriter::SetValue(&this->code_,&local_1c8,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,
               "{{PRE}}VerifyField{{REQUIRED}}<{{SIZE}}>(verifier, {{OFFSET}}, {{ALIGN}})\\",
               &local_211);
    CodeWriter::operator+=(&this->code_,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"OFFSET_SIZE",&local_239);
    pcVar3 = "";
    if ((prefix_local[0x115] & 1U) != 0) {
      pcVar3 = "64";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,pcVar3,&local_261);
    CodeWriter::SetValue(&this->code_,&local_238,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,
               "{{PRE}}VerifyOffset{{OFFSET_SIZE}}{{REQUIRED}}(verifier, {{OFFSET}})\\",&local_289);
    CodeWriter::operator+=(&this->code_,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
  }
  switch(*(undefined4 *)(prefix_local + 200)) {
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"{{PRE}}verifier.VerifyString({{NAME}}())\\",&local_379);
    CodeWriter::operator+=(&this->code_,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    break;
  case 0xe:
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"{{PRE}}verifier.VerifyVector({{NAME}}())\\",&local_3a1);
    CodeWriter::operator+=(&this->code_,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
    iVar1 = *(int *)(prefix_local + 0xcc);
    if (iVar1 == 0xd) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,"{{PRE}}verifier.VerifyVectorOfStrings({{NAME}}())\\",
                 &local_3c9);
      CodeWriter::operator+=(&this->code_,&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator(&local_3c9);
    }
    else if (iVar1 == 0xf) {
      if ((*(byte *)(*(long *)(prefix_local + 0xd0) + 0x110) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"{{PRE}}verifier.VerifyVectorOfTables({{NAME}}())\\",
                   &local_3f1);
        CodeWriter::operator+=(&this->code_,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
      }
    }
    else if (iVar1 == 0x10) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_418,"ENUM_NAME",&local_419);
      CodeWriter::SetValue(&this->code_,&local_418,*(string **)(prefix_local + 0xd8));
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator(&local_419);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,
                 "{{PRE}}Verify{{ENUM_NAME}}Vector(verifier, {{NAME}}(), {{NAME}}_type())\\",
                 (allocator<char> *)(nfn.field_2._M_local_buf + 0xf));
      CodeWriter::operator+=(&this->code_,&local_440);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator((allocator<char> *)(nfn.field_2._M_local_buf + 0xf));
    }
    GetNestedFlatBufferName_abi_cxx11_((string *)local_468,this,(FieldDef *)prefix_local);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"CPP_NAME",&local_489)
      ;
      CodeWriter::SetValue(&this->code_,&local_488,(string *)local_468);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,
                 "{{PRE}}verifier.VerifyNestedFlatBuffer<{{CPP_NAME}}>({{NAME}}(), nullptr)\\",
                 &local_4b1);
      CodeWriter::operator+=(&this->code_,&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
    }
    else if ((prefix_local[0x114] & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,
                 "{{PRE}}flexbuffers::VerifyNestedFlexBuffer({{NAME}}(), verifier)\\",&local_4d9);
      CodeWriter::operator+=(&this->code_,&local_4d8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::allocator<char>::~allocator(&local_4d9);
    }
    std::__cxx11::string::~string((string *)local_468);
    break;
  case 0xf:
    if ((*(byte *)(*(long *)(prefix_local + 0xd0) + 0x110) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"{{PRE}}verifier.VerifyTable({{NAME}}())\\",&local_351);
      CodeWriter::operator+=(&this->code_,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
    }
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"ENUM_NAME",&local_2b1);
    CodeWriter::SetValue(&this->code_,&local_2b0,*(string **)(prefix_local + 0xd8));
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"SUFFIX",&local_2d9);
    pcVar3 = UnionTypeFieldSuffix();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,pcVar3,&local_301);
    CodeWriter::SetValue(&this->code_,&local_2d8,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,
               "{{PRE}}Verify{{ENUM_NAME}}(verifier, {{NAME}}(), {{NAME}}{{SUFFIX}}())\\",&local_329
              );
    CodeWriter::operator+=(&this->code_,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    break;
  default:
  }
  return;
}

Assistant:

void GenVerifyCall(const FieldDef &field, const char *prefix) {
    code_.SetValue("PRE", prefix);
    code_.SetValue("NAME", Name(field));
    code_.SetValue("REQUIRED", field.IsRequired() ? "Required" : "");
    code_.SetValue("SIZE", GenTypeSize(field.value.type));
    code_.SetValue("OFFSET", GenFieldOffsetName(field));
    if (IsScalar(field.value.type.base_type) || IsStruct(field.value.type)) {
      code_.SetValue("ALIGN", NumToString(InlineAlignment(field.value.type)));
      code_ +=
          "{{PRE}}VerifyField{{REQUIRED}}<{{SIZE}}>(verifier, "
          "{{OFFSET}}, {{ALIGN}})\\";
    } else {
      code_.SetValue("OFFSET_SIZE", field.offset64 ? "64" : "");
      code_ +=
          "{{PRE}}VerifyOffset{{OFFSET_SIZE}}{{REQUIRED}}(verifier, "
          "{{OFFSET}})\\";
    }

    switch (field.value.type.base_type) {
      case BASE_TYPE_UNION: {
        code_.SetValue("ENUM_NAME", field.value.type.enum_def->name);
        code_.SetValue("SUFFIX", UnionTypeFieldSuffix());
        code_ +=
            "{{PRE}}Verify{{ENUM_NAME}}(verifier, {{NAME}}(), "
            "{{NAME}}{{SUFFIX}}())\\";
        break;
      }
      case BASE_TYPE_STRUCT: {
        if (!field.value.type.struct_def->fixed) {
          code_ += "{{PRE}}verifier.VerifyTable({{NAME}}())\\";
        }
        break;
      }
      case BASE_TYPE_STRING: {
        code_ += "{{PRE}}verifier.VerifyString({{NAME}}())\\";
        break;
      }
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        code_ += "{{PRE}}verifier.VerifyVector({{NAME}}())\\";

        switch (field.value.type.element) {
          case BASE_TYPE_STRING: {
            code_ += "{{PRE}}verifier.VerifyVectorOfStrings({{NAME}}())\\";
            break;
          }
          case BASE_TYPE_STRUCT: {
            if (!field.value.type.struct_def->fixed) {
              code_ += "{{PRE}}verifier.VerifyVectorOfTables({{NAME}}())\\";
            }
            break;
          }
          case BASE_TYPE_UNION: {
            code_.SetValue("ENUM_NAME", field.value.type.enum_def->name);
            code_ +=
                "{{PRE}}Verify{{ENUM_NAME}}Vector(verifier, {{NAME}}(), "
                "{{NAME}}_type())\\";
            break;
          }
          default: break;
        }

        auto nfn = GetNestedFlatBufferName(field);
        if (!nfn.empty()) {
          code_.SetValue("CPP_NAME", nfn);
          // FIXME: file_identifier.
          code_ +=
              "{{PRE}}verifier.VerifyNestedFlatBuffer<{{CPP_NAME}}>"
              "({{NAME}}(), nullptr)\\";
        } else if (field.flexbuffer) {
          code_ +=
              "{{PRE}}flexbuffers::VerifyNestedFlexBuffer"
              "({{NAME}}(), verifier)\\";
        }
        break;
      }
      default: {
        break;
      }
    }
  }